

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateIsInitialized
          (ImmutableMessageGenerator *this,Printer *printer)

{
  byte bVar1;
  FieldDescriptor *pFVar2;
  ClassNameResolver *pCVar3;
  bool bVar4;
  JavaType JVar5;
  FieldGeneratorInfo *pFVar6;
  Descriptor *pDVar7;
  FieldDescriptor *pFVar8;
  Nonnull<const_char_*> pcVar9;
  undefined8 extraout_RAX;
  long lVar10;
  long lVar11;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string local_60;
  
  text._M_str = "private byte memoizedIsInitialized = -1;\n";
  text._M_len = 0x29;
  io::Printer::Print<>(printer,text);
  text_00._M_str = "@java.lang.Override\npublic final boolean isInitialized() {\n";
  text_00._M_len = 0x3b;
  io::Printer::Print<>(printer,text_00);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_01._M_str =
       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized == 1) return true;\nif (isInitialized == 0) return false;\n\n"
  ;
  text_01._M_len = 0x78;
  io::Printer::Print<>(printer,text_01);
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar7->field_count_) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pFVar8 = (FieldDescriptor *)(&pDVar7->fields_->super_SymbolBase + lVar10);
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar8);
      bVar4 = FieldDescriptor::is_required(pFVar8);
      if (bVar4) {
        text_02._M_str = "if (!has$name$()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n";
        text_02._M_len = 0x43;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,text_02,(char (*) [5])0x10f3c63,&pFVar6->capitalized_name);
      }
      lVar11 = lVar11 + 1;
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      lVar10 = lVar10 + 0x58;
    } while (lVar11 < pDVar7->field_count_);
  }
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar7->field_count_) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      pFVar2 = pDVar7->fields_;
      pFVar8 = (FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar11);
      pFVar6 = Context::GetFieldGeneratorInfo(this->context_,pFVar8);
      JVar5 = GetJavaType(pFVar8);
      if (JVar5 == JAVATYPE_MESSAGE) {
        pDVar7 = FieldDescriptor::message_type(pFVar8);
        bVar4 = HasRequiredFields(pDVar7);
        if (bVar4) {
          bVar4 = FieldDescriptor::is_required(pFVar8);
          if (bVar4) {
            pCVar3 = this->name_resolver_;
            pDVar7 = FieldDescriptor::message_type(pFVar8);
            ClassNameResolver::GetClassName_abi_cxx11_(&local_60,pCVar3,pDVar7,true);
            text_03._M_str =
                 "if (!get$name$().isInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n"
            ;
            text_03._M_len = 0x53;
            io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                      (printer,text_03,(char (*) [5])0x1146303,&local_60,(char (*) [5])0x10f3c63,
                       &pFVar6->capitalized_name);
          }
          else {
            bVar1 = (&pFVar2->field_0x1)[lVar11];
            bVar4 = (bool)((bVar1 & 0x20) >> 5);
            if (0xbf < bVar1 == bVar4) {
              pcVar9 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                 (bVar4,0xbf < bVar1,
                                  "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            if (pcVar9 != (Nonnull<const_char_*>)0x0) {
              GenerateIsInitialized();
LAB_00e9a0ed:
              GenerateIsInitialized();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              _Unwind_Resume(extraout_RAX);
            }
            if (((&pFVar2->field_0x1)[lVar11] & 0x20) == 0) {
              text_04._M_str =
                   "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
              ;
              text_04._M_len = 0x70;
              io::Printer::Print<char[5],std::__cxx11::string>
                        (printer,text_04,(char (*) [5])0x10f3c63,&pFVar6->capitalized_name);
              goto LAB_00e99f3e;
            }
            pDVar7 = FieldDescriptor::message_type(pFVar8);
            if ((pDVar7->options_->field_0)._impl_.map_entry_ == true) {
              pDVar7 = FieldDescriptor::message_type(pFVar8);
              pCVar3 = this->name_resolver_;
              pFVar8 = Descriptor::map_value(pDVar7);
              if ((ulong)pFVar8->type_ == 0xb) {
                pcVar9 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (0xb,(ulong)pFVar8->type_,
                                    "FieldDescriptor::TYPE_MESSAGE == value_field->type()");
              }
              if (pcVar9 != (Nonnull<const_char_*>)0x0) goto LAB_00e9a0ed;
              pDVar7 = FieldDescriptor::message_type(pFVar8);
              ClassNameResolver::GetClassName_abi_cxx11_(&local_60,pCVar3,pDVar7,true);
              text_05._M_str =
                   "for ($type$ item : get$name$Map().values()) {\n  if (!item.isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
              ;
              text_05._M_len = 0x84;
              io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                        (printer,text_05,(char (*) [5])0x1146303,&local_60,(char (*) [5])0x10f3c63,
                         &pFVar6->capitalized_name);
            }
            else {
              pCVar3 = this->name_resolver_;
              pDVar7 = FieldDescriptor::message_type(pFVar8);
              ClassNameResolver::GetClassName_abi_cxx11_(&local_60,pCVar3,pDVar7,true);
              text_06._M_str =
                   "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    memoizedIsInitialized = 0;\n    return false;\n  }\n}\n"
              ;
              text_06._M_len = 0x8b;
              io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
                        (printer,text_06,(char (*) [5])0x1146303,&local_60,(char (*) [5])0x10f3c63,
                         &pFVar6->capitalized_name);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
      }
LAB_00e99f3e:
      lVar10 = lVar10 + 1;
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      lVar11 = lVar11 + 0x58;
    } while (lVar10 < pDVar7->field_count_);
  }
  if (0 < pDVar7->extension_range_count_) {
    text_07._M_str =
         "if (!extensionsAreInitialized()) {\n  memoizedIsInitialized = 0;\n  return false;\n}\n";
    text_07._M_len = 0x52;
    io::Printer::Print<>(printer,text_07);
  }
  io::Printer::Outdent(printer);
  text_08._M_str = "  memoizedIsInitialized = 1;\n";
  text_08._M_len = 0x1d;
  io::Printer::Print<>(printer,text_08);
  text_09._M_str = "  return true;\n}\n\n";
  text_09._M_len = 0x12;
  io::Printer::Print<>(printer,text_09);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateIsInitialized(io::Printer* printer) {
  // Memoizes whether the protocol buffer is fully initialized (has all
  // required fields). -1 means not yet computed. 0 means false and 1 means
  // true.
  printer->Print("private byte memoizedIsInitialized = -1;\n");
  printer->Print(
      "@java.lang.Override\n"
      "public final boolean isInitialized() {\n");
  printer->Indent();

  // Don't directly compare to -1 to avoid an Android x86 JIT bug.
  printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized == 1) return true;\n"
      "if (isInitialized == 0) return false;\n"
      "\n");

  // Check that all required fields in this message are set.
  // TODO:  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);

    if (field->is_required()) {
      printer->Print(
          "if (!has$name$()) {\n"
          "  memoizedIsInitialized = 0;\n"
          "  return false;\n"
          "}\n",
          "name", info->capitalized_name);
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      if (field->is_required()) {
        printer->Print(
            "if (!get$name$().isInitialized()) {\n"
            "  memoizedIsInitialized = 0;\n"
            "  return false;\n"
            "}\n",
            "type",
            name_resolver_->GetImmutableClassName(field->message_type()),
            "name", info->capitalized_name);
      } else if (field->is_repeated()) {
        if (IsMapEntry(field->message_type())) {
          printer->Print(
              "for ($type$ item : get$name$Map().values()) {\n"
              "  if (!item.isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type",
              MapValueImmutableClassdName(field->message_type(),
                                          name_resolver_),
              "name", info->capitalized_name);
        } else {
          printer->Print(
              "for (int i = 0; i < get$name$Count(); i++) {\n"
              "  if (!get$name$(i).isInitialized()) {\n"
              "    memoizedIsInitialized = 0;\n"
              "    return false;\n"
              "  }\n"
              "}\n",
              "type",
              name_resolver_->GetImmutableClassName(field->message_type()),
              "name", info->capitalized_name);
        }
      } else {
        printer->Print(
            "if (has$name$()) {\n"
            "  if (!get$name$().isInitialized()) {\n"
            "    memoizedIsInitialized = 0;\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "name", info->capitalized_name);
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "if (!extensionsAreInitialized()) {\n"
        "  memoizedIsInitialized = 0;\n"
        "  return false;\n"
        "}\n");
  }

  printer->Outdent();

  printer->Print("  memoizedIsInitialized = 1;\n");

  printer->Print(
      "  return true;\n"
      "}\n"
      "\n");
}